

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O0

void __thiscall quad::set_bounding_box(quad *this)

{
  aabb local_100;
  vec3 local_d0;
  vec3 local_b8;
  undefined1 local_a0 [8];
  aabb bbox_diagonal2;
  vec3 local_58;
  undefined1 local_40 [8];
  aabb bbox_diagonal1;
  quad *this_local;
  
  bbox_diagonal1.z.max = (double)this;
  operator+((vec3 *)&bbox_diagonal2.z.max,&this->Q,&this->u);
  operator+(&local_58,(vec3 *)&bbox_diagonal2.z.max,&this->v);
  aabb::aabb((aabb *)local_40,&this->Q,&local_58);
  operator+(&local_b8,&this->Q,&this->u);
  operator+(&local_d0,&this->Q,&this->v);
  aabb::aabb((aabb *)local_a0,&local_b8,&local_d0);
  aabb::aabb(&local_100,(aabb *)local_40,(aabb *)local_a0);
  memcpy(&this->bbox,&local_100,0x30);
  return;
}

Assistant:

virtual void set_bounding_box() {
        // Compute the bounding box of all four vertices.
        auto bbox_diagonal1 = aabb(Q, Q + u + v);
        auto bbox_diagonal2 = aabb(Q + u, Q + v);
        bbox = aabb(bbox_diagonal1, bbox_diagonal2);
    }